

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  value_type pcVar2;
  char *file;
  key_type rhs_expression;
  uint *lhs;
  AssertHelper *this_01;
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *this_03;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht2_2;
  TypeParam ht1_2;
  AssertionResult gtest_ar;
  TypeParam ht2_1;
  TypeParam ht1_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8a0;
  uint *in_stack_fffffffffffff8a8;
  int iVar3;
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8b0;
  char *in_stack_fffffffffffff8b8;
  allocator_type *in_stack_fffffffffffff8c0;
  key_equal *in_stack_fffffffffffff8c8;
  Type type;
  hasher *in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  uint i;
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff8e0;
  char *in_stack_fffffffffffff900;
  char *in_stack_fffffffffffff908;
  char *in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  uint i_00;
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff920;
  AssertionResult local_640 [2];
  char *local_620;
  undefined4 local_614;
  AssertionResult local_610 [3];
  value_type local_5d8;
  AssertHelper *local_5d0;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_5c8;
  Hasher local_5b8;
  Hasher local_5ac [13];
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_510;
  Hasher local_500;
  Hasher local_4f4 [14];
  size_type local_448;
  undefined4 local_43c;
  AssertionResult local_438 [3];
  value_type local_400;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_3f8;
  Hasher local_3e8;
  Hasher local_3dc [13];
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_340;
  Hasher local_330;
  Hasher local_324 [13];
  string local_288 [55];
  undefined1 local_251;
  AssertionResult local_250;
  string local_240 [55];
  byte local_209;
  AssertionResult local_208 [3];
  value_type local_1d0;
  value_type local_1a0;
  key_type local_198;
  key_type local_190;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_188;
  Hasher local_178;
  Hasher local_16c [14];
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL> local_c0;
  Hasher local_b0;
  Hasher local_a4 [13];
  
  Hasher::Hasher(local_a4,0);
  Hasher::Hasher(&local_b0,0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::Alloc(&local_c0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (in_stack_fffffffffffff8e0,CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8)
             ,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_c0);
  Hasher::Hasher(local_16c,0);
  Hasher::Hasher(&local_178,0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::Alloc(&local_188,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (in_stack_fffffffffffff8e0,CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8)
             ,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_188);
  local_190 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff8a0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_198 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff8a0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_1a0 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff920,
           (value_type *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
  local_1d0 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff920,
           (value_type *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
  bVar1 = google::
          BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff8a0,
                       (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_209 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8a0,
             (bool *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),(type *)0xb7718d)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_208);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
               in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8d0,
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(char *)in_stack_fffffffffffff8c0,
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(char *)in_stack_fffffffffffff8b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff920,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    std::__cxx11::string::~string(local_240);
    testing::Message::~Message((Message *)0xb772d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb77368);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff8a0,
              (HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_251 = google::
              BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff8a0,
                           (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff8a0,
             (bool *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),(type *)0xb773c6)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
               in_stack_fffffffffffff910,in_stack_fffffffffffff908,in_stack_fffffffffffff900);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8d0,
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(char *)in_stack_fffffffffffff8c0,
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(char *)in_stack_fffffffffffff8b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff920,
               (Message *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    std::__cxx11::string::~string(local_288);
    testing::Message::~Message((Message *)0xb7749b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb77532);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7753f);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0xb7754c);
  i_00 = 0;
  Hasher::Hasher(local_324,0);
  Hasher::Hasher(&local_330,i_00);
  this_02 = (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             *)(ulong)i_00;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::Alloc(&local_340,i_00,(int *)this_02);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (in_stack_fffffffffffff8e0,CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8)
             ,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_340);
  Hasher::Hasher(local_3dc,0);
  Hasher::Hasher(&local_3e8,0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::Alloc(&local_3f8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (in_stack_fffffffffffff8e0,CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8)
             ,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_3f8);
  local_400 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_02,(value_type *)CONCAT44(i_00,in_stack_fffffffffffff918));
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff8a0,
              (HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_43c = 0;
  local_448 = google::
              BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xb776c9);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
             (unsigned_long *)in_stack_fffffffffffff8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_438);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8d0);
    testing::AssertionResult::failure_message((AssertionResult *)0xb777eb);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8d0,
               (Type)((ulong)in_stack_fffffffffffff8c8 >> 0x20),(char *)in_stack_fffffffffffff8c0,
               (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),(char *)in_stack_fffffffffffff8b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_02,(Message *)CONCAT44(i_00,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0xb77848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb778b9);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0xb778c6);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0xb778d3);
  i = 0;
  Hasher::Hasher(local_4f4,0);
  Hasher::Hasher(&local_500,i);
  this_03 = (HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
             *)(ulong)i;
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::Alloc(&local_510,i,(int *)this_03);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (this_03,CONCAT44(i,in_stack_fffffffffffff8d8),in_stack_fffffffffffff8d0,
             in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_510);
  Hasher::Hasher(local_5ac,0);
  Hasher::Hasher(&local_5b8,0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::Alloc(&local_5c8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (this_03,CONCAT44(i,in_stack_fffffffffffff8d8),in_stack_fffffffffffff8d0,
             in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  Alloc<ValueType,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_5c8);
  this_00 = (AssertHelper *)
            HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8b0,(int)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
  local_5d0 = this_00;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff8a0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  pcVar2 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c);
  local_5d8 = pcVar2;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_02,(value_type *)CONCAT44(i_00,in_stack_fffffffffffff918));
  type = (Type)((ulong)pcVar2 >> 0x20);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff8a0,
              (HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_614 = 1;
  file = (char *)google::
                 BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                 ::size((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xb77a6c);
  local_620 = file;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
             (unsigned_long *)in_stack_fffffffffffff8a0);
  iVar3 = (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_610);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff8b8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xb77b8e);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,file,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
               (char *)in_stack_fffffffffffff8b0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_02,(Message *)CONCAT44(i_00,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8a0);
    testing::Message::~Message((Message *)0xb77beb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb77c5c);
  rhs_expression =
       HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(in_stack_fffffffffffff8b0,iVar3);
  lhs = (uint *)google::
                BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                ::count((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff8a0,
                        (key_type *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffff8b8,rhs_expression,lhs,(unsigned_long *)in_stack_fffffffffffff8a0
            );
  iVar3 = (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_640);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    this_01 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb77d29)
    ;
    testing::internal::AssertHelper::AssertHelper(this_00,type,file,iVar3,rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_02,(Message *)CONCAT44(i_00,in_stack_fffffffffffff918));
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0xb77d86);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb77df1);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0xb77dfe);
  google::
  HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
              *)0xb77e0b);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}